

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

Statement *
slang::ast::ImmediateAssertionStatement::fromSyntax
          (Compilation *compilation,ImmediateAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  StatementSyntax *pSVar1;
  ElseClauseSyntax *pEVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ImmediateAssertionStatement *stmt;
  SourceRange sourceRange;
  bool isFinal;
  bool isDeferred;
  Statement *ifFalse;
  AssertionKind assertKind;
  Statement *ifTrue;
  SourceRange local_40;
  Expression *this;
  
  assertKind = SemanticFacts::getAssertKind((syntax->super_StatementSyntax).super_SyntaxNode.kind);
  iVar5 = Expression::bind((int)(((syntax->expr).ptr)->expression).ptr,(sockaddr *)context,0);
  this = (Expression *)CONCAT44(extraout_var,iVar5);
  bVar3 = Expression::bad(this);
  if (!bVar3) {
    bVar4 = ASTContext::requireBooleanConvertible(context,this);
    bVar3 = bVar3 || !bVar4;
  }
  ifTrue = (Statement *)0x0;
  ifFalse = (Statement *)0x0;
  pSVar1 = ((syntax->action).ptr)->statement;
  if (pSVar1 != (StatementSyntax *)0x0) {
    iVar5 = Statement::bind((int)pSVar1,(sockaddr *)context,(socklen_t)stmtCtx);
    ifTrue = (Statement *)CONCAT44(extraout_var_00,iVar5);
  }
  pEVar2 = ((syntax->action).ptr)->elseClause;
  if (pEVar2 != (ElseClauseSyntax *)0x0) {
    iVar5 = Statement::bind((int)(pEVar2->clause).ptr,(sockaddr *)context,(socklen_t)stmtCtx);
    ifFalse = (Statement *)CONCAT44(extraout_var_01,iVar5);
  }
  isFinal = false;
  isDeferred = syntax->delay != (DeferredAssertionSyntax *)0x0;
  if (isDeferred) {
    isFinal = (syntax->delay->finalKeyword).info != (Info *)0x0;
  }
  if (((assertKind & ~Assume) == CoverProperty) && (ifFalse != (Statement *)0x0)) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange
                            (&((syntax->action).ptr)->elseClause->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x100008,sourceRange);
    bVar3 = true;
  }
  if (isDeferred == true) {
    if (ifTrue != (Statement *)0x0) {
      checkDeferredAssertAction(ifTrue,context);
    }
    if (ifFalse != (Statement *)0x0) {
      checkDeferredAssertAction(ifFalse,context);
    }
  }
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&assertKind,this,&ifTrue,&ifFalse,&isDeferred,
                    &isFinal,&local_40);
  if (((bVar3 != false) || ((ifTrue != (Statement *)0x0 && (ifTrue->kind == Invalid)))) ||
     ((ifFalse != (Statement *)0x0 && (ifFalse->kind == Invalid)))) {
    stmt = (ImmediateAssertionStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
  return &stmt->super_Statement;
}

Assistant:

Statement& ImmediateAssertionStatement::fromSyntax(Compilation& compilation,
                                                   const ImmediateAssertionStatementSyntax& syntax,
                                                   const ASTContext& context,
                                                   StatementContext& stmtCtx) {
    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);
    auto& cond = Expression::bind(*syntax.expr->expression, context);
    bool bad = cond.bad();

    if (!bad && !context.requireBooleanConvertible(cond))
        bad = true;

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    bool isDeferred = syntax.delay != nullptr;
    bool isFinal = false;
    if (isDeferred)
        isFinal = syntax.delay->finalKeyword.valid();

    bool isCover = assertKind == AssertionKind::CoverProperty ||
                   assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        context.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }

    if (isDeferred) {
        if (ifTrue)
            checkDeferredAssertAction(*ifTrue, context);
        if (ifFalse)
            checkDeferredAssertAction(*ifFalse, context);
    }

    auto result = compilation.emplace<ImmediateAssertionStatement>(assertKind, cond, ifTrue,
                                                                   ifFalse, isDeferred, isFinal,
                                                                   syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    return *result;
}